

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStruct_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,IDLOptions *opts)

{
  Type *pTVar1;
  Type type;
  string *psVar2;
  bool bVar3;
  __type _Var4;
  Value *pVVar5;
  SymbolTable<flatbuffers::Value> *this_00;
  reference ppFVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  string local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  string local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined1 local_868 [8];
  string type_name_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  undefined1 local_808 [8];
  string camel_name_1;
  FieldDef *field_1;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_7d8;
  iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  allocator<char> local_709;
  string local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  Type local_6a8;
  undefined1 local_688 [8];
  string union_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string utype_name;
  string camel_name;
  undefined1 local_108 [8];
  string type_name;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_d8;
  iterator it;
  undefined1 local_b0 [8];
  string class_name;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *code;
  IDLOptions *opts_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  local_30 = code_ptr;
  code = (string *)opts;
  opts_local = (IDLOptions *)code_ptr;
  code_ptr_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"private",&local_51);
  pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                     (&(struct_def->super_Definition).attributes,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if (pVVar5 == (Value *)0x0) {
    std::__cxx11::string::operator+=((string *)local_30,"public ");
  }
  else {
    std::__cxx11::string::operator+=((string *)local_30,"internal ");
  }
  psVar2 = code_ptr_local + 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"csharp_partial",
             (allocator<char> *)(class_name.field_2._M_local_buf + 0xf));
  pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                     ((SymbolTable<flatbuffers::Value> *)((long)&psVar2->field_2 + 8),&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)(class_name.field_2._M_local_buf + 0xf));
  if (pVVar5 != (Value *)0x0) {
    std::__cxx11::string::operator+=((string *)local_30,"partial ");
  }
  GenTypeName_ObjectAPI((string *)local_b0,this,code_ptr_local,(IDLOptions *)code);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,"class ",
                 (string *)local_b0);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&it);
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::operator+=((string *)local_30,"\n{\n");
  local_d8._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  ((long)&code_ptr_local[7].field_2 + 8));
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       ((long)&code_ptr_local[7].field_2 + 8));
    bVar3 = __gnu_cxx::operator!=
                      (&local_d8,
                       (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar3) break;
    ppFVar6 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_d8);
    type_name.field_2._8_8_ = *ppFVar6;
    if ((((((FieldDef *)type_name.field_2._8_8_)->deprecated & 1U) == 0) &&
        ((((FieldDef *)type_name.field_2._8_8_)->value).type.base_type != BASE_TYPE_UTYPE)) &&
       ((((FieldDef *)type_name.field_2._8_8_)->value).type.element != BASE_TYPE_UTYPE)) {
      GenTypeGet_ObjectAPI_abi_cxx11_
                ((string *)local_108,this,(((FieldDef *)type_name.field_2._8_8_)->value).type,
                 (IDLOptions *)code);
      bVar3 = FieldDef::IsScalarOptional((FieldDef *)type_name.field_2._8_8_);
      if (bVar3) {
        std::__cxx11::string::operator+=((string *)local_108,"?");
      }
      Name_abi_cxx11_((string *)((long)&utype_name.field_2 + 8),this,
                      (FieldDef *)type_name.field_2._8_8_);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&utype_name.field_2 + 8),code_ptr_local);
      if (_Var4) {
        std::__cxx11::string::operator+=((string *)(utype_name.field_2._M_local_buf + 8),"_");
      }
      if ((code[0xc]._M_string_length & 0x10000) != 0) {
        bVar3 = IsUnion((Type *)(type_name.field_2._8_8_ + 200));
        if (bVar3) {
          NamespacedName_abi_cxx11_
                    ((string *)local_168,this,*(Definition **)(type_name.field_2._8_8_ + 0xd8));
          std::operator+(&local_1a8,"  [Newtonsoft.Json.JsonProperty(\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         type_name.field_2._8_8_);
          std::operator+(&local_188,&local_1a8,"_type\")]\n");
          std::__cxx11::string::operator+=((string *)local_30,(string *)&local_188);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_1a8);
          bVar3 = IsVector((Type *)(type_name.field_2._8_8_ + 200));
          if (bVar3) {
            std::operator+(&local_228,"  private ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168);
            std::operator+(&local_208,&local_228,"[] ");
            std::operator+(&local_1e8,&local_208,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_1c8,&local_1e8,"Type {\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_228);
            std::__cxx11::string::operator+=((string *)local_30,"    get {\n");
            std::operator+(&local_268,"      if (this.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_248,&local_268," == null) return null;\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_248);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_268);
            std::operator+(&local_2e8,"      var _o = new ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168);
            std::operator+(&local_2c8,&local_2e8,"[this.");
            std::operator+(&local_2a8,&local_2c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_288,&local_2a8,".Count];\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_288);
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::__cxx11::string::~string((string *)&local_2c8);
            std::__cxx11::string::~string((string *)&local_2e8);
            std::operator+(&local_328,
                           "      for (var _j = 0; _j < _o.Length; ++_j) { _o[_j] = this.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_308,&local_328,"[_j].Type; }\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_308);
            std::__cxx11::string::~string((string *)&local_308);
            std::__cxx11::string::~string((string *)&local_328);
            std::__cxx11::string::operator+=((string *)local_30,"      return _o;\n");
            std::__cxx11::string::operator+=((string *)local_30,"    }\n");
            std::__cxx11::string::operator+=((string *)local_30,"    set {\n");
            std::operator+(&local_3a8,"      this.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_388,&local_3a8," = new List<");
            std::operator+(&local_368,&local_388,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168);
            std::operator+(&local_348,&local_368,"Union>();\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_348);
            std::__cxx11::string::~string((string *)&local_348);
            std::__cxx11::string::~string((string *)&local_368);
            std::__cxx11::string::~string((string *)&local_388);
            std::__cxx11::string::~string((string *)&local_3a8);
            std::__cxx11::string::operator+=
                      ((string *)local_30,"      for (var _j = 0; _j < value.Length; ++_j) {\n");
            std::operator+(&local_3e8,"        var _o = new ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168);
            std::operator+(&local_3c8,&local_3e8,"Union();\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_3c8);
            std::__cxx11::string::~string((string *)&local_3c8);
            std::__cxx11::string::~string((string *)&local_3e8);
            std::__cxx11::string::operator+=((string *)local_30,"        _o.Type = value[_j];\n");
            std::operator+(&local_428,"        this.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_408,&local_428,".Add(_o);\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_408);
            std::__cxx11::string::~string((string *)&local_408);
            std::__cxx11::string::~string((string *)&local_428);
            std::__cxx11::string::operator+=((string *)local_30,"      }\n");
            std::__cxx11::string::operator+=((string *)local_30,"    }\n");
            std::__cxx11::string::operator+=((string *)local_30,"  }\n");
          }
          else {
            std::operator+(&local_4a8,"  private ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168);
            std::operator+(&local_488,&local_4a8," ");
            std::operator+(&local_468,&local_488,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_448,&local_468,"Type {\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_448);
            std::__cxx11::string::~string((string *)&local_448);
            std::__cxx11::string::~string((string *)&local_468);
            std::__cxx11::string::~string((string *)&local_488);
            std::__cxx11::string::~string((string *)&local_4a8);
            std::__cxx11::string::operator+=((string *)local_30,"    get {\n");
            std::operator+(&local_568,"      return this.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_548,&local_568," != null ? this.");
            std::operator+(&local_528,&local_548,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_508,&local_528,".Type : ");
            std::operator+(&local_4e8,&local_508,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168);
            std::operator+(&local_4c8,&local_4e8,".NONE;\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_4c8);
            std::__cxx11::string::~string((string *)&local_4c8);
            std::__cxx11::string::~string((string *)&local_4e8);
            std::__cxx11::string::~string((string *)&local_508);
            std::__cxx11::string::~string((string *)&local_528);
            std::__cxx11::string::~string((string *)&local_548);
            std::__cxx11::string::~string((string *)&local_568);
            std::__cxx11::string::operator+=((string *)local_30,"    }\n");
            std::__cxx11::string::operator+=((string *)local_30,"    set {\n");
            std::operator+(&local_5e8,"      this.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_5c8,&local_5e8," = new ");
            std::operator+(&local_5a8,&local_5c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168);
            std::operator+(&local_588,&local_5a8,"Union();\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_588);
            std::__cxx11::string::~string((string *)&local_588);
            std::__cxx11::string::~string((string *)&local_5a8);
            std::__cxx11::string::~string((string *)&local_5c8);
            std::__cxx11::string::~string((string *)&local_5e8);
            std::operator+(&local_628,"      this.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utype_name.field_2 + 8));
            std::operator+(&local_608,&local_628,".Type = value;\n");
            std::__cxx11::string::operator+=((string *)local_30,(string *)&local_608);
            std::__cxx11::string::~string((string *)&local_608);
            std::__cxx11::string::~string((string *)&local_628);
            std::__cxx11::string::operator+=((string *)local_30,"    }\n");
            std::__cxx11::string::operator+=((string *)local_30,"  }\n");
          }
          std::__cxx11::string::~string((string *)local_168);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&union_name.field_2 + 8),"  [Newtonsoft.Json.JsonProperty(\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       type_name.field_2._8_8_);
        std::operator+(&local_648,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&union_name.field_2 + 8),"\")]\n");
        std::__cxx11::string::operator+=((string *)local_30,(string *)&local_648);
        std::__cxx11::string::~string((string *)&local_648);
        std::__cxx11::string::~string((string *)(union_name.field_2._M_local_buf + 8));
        bVar3 = IsUnion((Type *)(type_name.field_2._8_8_ + 200));
        if (bVar3) {
          bVar3 = IsVector((Type *)(type_name.field_2._8_8_ + 200));
          if (bVar3) {
            Type::VectorType(&local_6a8,(Type *)(type_name.field_2._8_8_ + 200));
            type.struct_def = local_6a8.struct_def;
            type.base_type = local_6a8.base_type;
            type.element = local_6a8.element;
            type.enum_def = local_6a8.enum_def;
            type.fixed_length = local_6a8.fixed_length;
            type._26_6_ = local_6a8._26_6_;
            GenTypeGet_ObjectAPI_abi_cxx11_((string *)local_688,this,type,(IDLOptions *)code);
          }
          else {
            std::__cxx11::string::string((string *)local_688,(string *)local_108);
          }
          std::operator+(&local_6e8,"  [Newtonsoft.Json.JsonConverter(typeof(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_688);
          std::operator+(&local_6c8,&local_6e8,"_JsonConverter))]\n");
          std::__cxx11::string::operator+=((string *)local_30,(string *)&local_6c8);
          std::__cxx11::string::~string((string *)&local_6c8);
          std::__cxx11::string::~string((string *)&local_6e8);
          std::__cxx11::string::~string((string *)local_688);
        }
        this_00 = (SymbolTable<flatbuffers::Value> *)(type_name.field_2._8_8_ + 0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"hash",&local_709);
        pVVar5 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&local_708);
        std::__cxx11::string::~string((string *)&local_708);
        std::allocator<char>::~allocator(&local_709);
        if (pVVar5 != (Value *)0x0) {
          std::__cxx11::string::operator+=((string *)local_30,"  [Newtonsoft.Json.JsonIgnore()]\n");
        }
      }
      std::operator+(&local_790,"  public ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
      ;
      std::operator+(&local_770,&local_790," ");
      std::operator+(&local_750,&local_770,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&utype_name.field_2 + 8));
      std::operator+(&local_730,&local_750," { get; set; }\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_730);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_750);
      std::__cxx11::string::~string((string *)&local_770);
      std::__cxx11::string::~string((string *)&local_790);
      std::__cxx11::string::~string((string *)(utype_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_108);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_d8);
  }
  std::__cxx11::string::operator+=((string *)local_30,"\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                 "  public ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  std::operator+(&local_7b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,"() {\n"
                );
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::~string((string *)&it_1);
  local_7d8._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  ((long)&code_ptr_local[7].field_2 + 8));
  while( true ) {
    field_1 = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)((long)&code_ptr_local[7].field_2 + 8));
    bVar3 = __gnu_cxx::operator!=
                      (&local_7d8,
                       (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field_1);
    if (!bVar3) break;
    ppFVar6 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_7d8);
    camel_name_1.field_2._8_8_ = *ppFVar6;
    if ((((((FieldDef *)camel_name_1.field_2._8_8_)->deprecated & 1U) == 0) &&
        ((((FieldDef *)camel_name_1.field_2._8_8_)->value).type.base_type != BASE_TYPE_UTYPE)) &&
       ((((FieldDef *)camel_name_1.field_2._8_8_)->value).type.element != BASE_TYPE_UTYPE)) {
      Name_abi_cxx11_((string *)local_808,this,(FieldDef *)camel_name_1.field_2._8_8_);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_808,code_ptr_local);
      if (_Var4) {
        std::__cxx11::string::operator+=((string *)local_808,"_");
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type_name_1.field_2 + 8),"    this.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_808)
      ;
      std::operator+(&local_828,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type_name_1.field_2 + 8)," = ");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_828);
      std::__cxx11::string::~string((string *)&local_828);
      std::__cxx11::string::~string((string *)(type_name_1.field_2._M_local_buf + 8));
      pTVar1 = (Type *)(camel_name_1.field_2._8_8_ + 200);
      local_888._0_4_ = pTVar1->base_type;
      local_888._4_4_ = pTVar1->element;
      uStack_880 = *(undefined8 *)(camel_name_1.field_2._8_8_ + 0xd0);
      local_878 = *(undefined8 *)(camel_name_1.field_2._8_8_ + 0xd8);
      uStack_870 = *(undefined8 *)(camel_name_1.field_2._8_8_ + 0xe0);
      GenTypeGet_ObjectAPI_abi_cxx11_((string *)local_868,this,*pTVar1,(IDLOptions *)code);
      bVar3 = IsScalar(*(BaseType *)(camel_name_1.field_2._8_8_ + 200));
      if (bVar3) {
        GenDefaultValue_abi_cxx11_(&local_8c8,this,(FieldDef *)camel_name_1.field_2._8_8_);
        std::operator+(&local_8a8,&local_8c8,";\n");
        std::__cxx11::string::operator+=((string *)local_30,(string *)&local_8a8);
        std::__cxx11::string::~string((string *)&local_8a8);
        std::__cxx11::string::~string((string *)&local_8c8);
      }
      else if (*(int *)(camel_name_1.field_2._8_8_ + 200) == 0xf) {
        bVar3 = IsStruct((Type *)(camel_name_1.field_2._8_8_ + 200));
        if (bVar3) {
          std::operator+(&local_908,"new ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_868);
          std::operator+(&local_8e8,&local_908,"();\n");
          std::__cxx11::string::operator+=((string *)local_30,(string *)&local_8e8);
          std::__cxx11::string::~string((string *)&local_8e8);
          std::__cxx11::string::~string((string *)&local_908);
        }
        else {
          std::__cxx11::string::operator+=((string *)local_30,"null;\n");
        }
      }
      else if (*(int *)(camel_name_1.field_2._8_8_ + 200) == 0x11) {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)&local_988,(ulong)local_868);
        std::operator+(&local_968,"new ",&local_988);
        NumToString<unsigned_short>
                  (&local_9a8,*(unsigned_short *)(camel_name_1.field_2._8_8_ + 0xe0));
        std::operator+(&local_948,&local_968,&local_9a8);
        std::operator+(&local_928,&local_948,"];\n");
        std::__cxx11::string::operator+=((string *)local_30,(string *)&local_928);
        std::__cxx11::string::~string((string *)&local_928);
        std::__cxx11::string::~string((string *)&local_948);
        std::__cxx11::string::~string((string *)&local_9a8);
        std::__cxx11::string::~string((string *)&local_968);
        std::__cxx11::string::~string((string *)&local_988);
      }
      else {
        std::__cxx11::string::operator+=((string *)local_30,"null;\n");
      }
      std::__cxx11::string::~string((string *)local_868);
      std::__cxx11::string::~string((string *)local_808);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_7d8);
  }
  std::__cxx11::string::operator+=((string *)local_30,"  }\n");
  if (((code[0xc]._M_string_length & 0x10000) != 0) &&
     (((this->super_BaseGenerator).parser_)->root_struct_def_ == (StructDef *)code_ptr_local)) {
    std::__cxx11::string::operator+=((string *)local_30,"\n");
    std::operator+(&local_9e8,"  public static ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    std::operator+(&local_9c8,&local_9e8," DeserializeFromJson(string jsonText) {\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_9c8);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::__cxx11::string::~string((string *)&local_9e8);
    std::operator+(&local_a28,"    return Newtonsoft.Json.JsonConvert.DeserializeObject<",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    std::operator+(&local_a08,&local_a28,">(jsonText);\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_a08);
    std::__cxx11::string::~string((string *)&local_a08);
    std::__cxx11::string::~string((string *)&local_a28);
    std::__cxx11::string::operator+=((string *)local_30,"  }\n");
    std::__cxx11::string::operator+=((string *)local_30,"  public string SerializeToJson() {\n");
    std::__cxx11::string::operator+=
              ((string *)local_30,
               "    return Newtonsoft.Json.JsonConvert.SerializeObject(this, Newtonsoft.Json.Formatting.Indented);\n"
              );
    std::__cxx11::string::operator+=((string *)local_30,"  }\n");
  }
  if (((this->super_BaseGenerator).parser_)->root_struct_def_ == (StructDef *)code_ptr_local) {
    std::operator+(&local_a68,"  public static ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    std::operator+(&local_a48,&local_a68," DeserializeFromBinary(byte[] fbBuffer) {\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_a48);
    std::__cxx11::string::~string((string *)&local_a48);
    std::__cxx11::string::~string((string *)&local_a68);
    std::operator+(&local_ae8,"    return ",code_ptr_local);
    std::operator+(&local_ac8,&local_ae8,".GetRootAs");
    std::operator+(&local_aa8,&local_ac8,code_ptr_local);
    std::operator+(&local_a88,&local_aa8,"(new ByteBuffer(fbBuffer)).UnPack();\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_a88);
    std::__cxx11::string::~string((string *)&local_a88);
    std::__cxx11::string::~string((string *)&local_aa8);
    std::__cxx11::string::~string((string *)&local_ac8);
    std::__cxx11::string::~string((string *)&local_ae8);
    std::__cxx11::string::operator+=((string *)local_30,"  }\n");
    std::__cxx11::string::operator+=((string *)local_30,"  public byte[] SerializeToBinary() {\n");
    std::__cxx11::string::operator+=
              ((string *)local_30,"    var fbb = new FlatBufferBuilder(0x10000);\n");
    std::operator+(&local_ba8,"    ",code_ptr_local);
    std::operator+(&local_b88,&local_ba8,".Finish");
    std::operator+(&local_b68,&local_b88,code_ptr_local);
    std::operator+(&local_b48,&local_b68,"Buffer(fbb, ");
    std::operator+(&local_b28,&local_b48,code_ptr_local);
    std::operator+(&local_b08,&local_b28,".Pack(fbb, this));\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_b08);
    std::__cxx11::string::~string((string *)&local_b08);
    std::__cxx11::string::~string((string *)&local_b28);
    std::__cxx11::string::~string((string *)&local_b48);
    std::__cxx11::string::~string((string *)&local_b68);
    std::__cxx11::string::~string((string *)&local_b88);
    std::__cxx11::string::~string((string *)&local_ba8);
    std::__cxx11::string::operator+=
              ((string *)local_30,"    return fbb.DataBuffer.ToSizedArray();\n");
    std::__cxx11::string::operator+=((string *)local_30,"  }\n");
  }
  std::__cxx11::string::operator+=((string *)local_30,"}\n\n");
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void GenStruct_ObjectAPI(StructDef &struct_def, std::string *code_ptr,
                           const IDLOptions &opts) const {
    auto &code = *code_ptr;
    if (struct_def.attributes.Lookup("private")) {
      code += "internal ";
    } else {
      code += "public ";
    }
    if (struct_def.attributes.Lookup("csharp_partial")) {
      // generate a partial class for this C# struct/table
      code += "partial ";
    }
    auto class_name = GenTypeName_ObjectAPI(struct_def.name, opts);
    code += "class " + class_name;
    code += "\n{\n";
    // Generate Properties
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.value.type.base_type == BASE_TYPE_UTYPE) continue;
      if (field.value.type.element == BASE_TYPE_UTYPE) continue;
      auto type_name = GenTypeGet_ObjectAPI(field.value.type, opts);
      if (field.IsScalarOptional()) type_name += "?";
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      if (opts.cs_gen_json_serializer) {
        if (IsUnion(field.value.type)) {
          auto utype_name = NamespacedName(*field.value.type.enum_def);
          code +=
              "  [Newtonsoft.Json.JsonProperty(\"" + field.name + "_type\")]\n";
          if (IsVector(field.value.type)) {
            code += "  private " + utype_name + "[] " + camel_name + "Type {\n";
            code += "    get {\n";
            code += "      if (this." + camel_name + " == null) return null;\n";
            code += "      var _o = new " + utype_name + "[this." + camel_name +
                    ".Count];\n";
            code +=
                "      for (var _j = 0; _j < _o.Length; ++_j) { _o[_j] = "
                "this." +
                camel_name + "[_j].Type; }\n";
            code += "      return _o;\n";
            code += "    }\n";
            code += "    set {\n";
            code += "      this." + camel_name + " = new List<" + utype_name +
                    "Union>();\n";
            code += "      for (var _j = 0; _j < value.Length; ++_j) {\n";
            code += "        var _o = new " + utype_name + "Union();\n";
            code += "        _o.Type = value[_j];\n";
            code += "        this." + camel_name + ".Add(_o);\n";
            code += "      }\n";
            code += "    }\n";
            code += "  }\n";
          } else {
            code += "  private " + utype_name + " " + camel_name + "Type {\n";
            code += "    get {\n";
            code += "      return this." + camel_name + " != null ? this." +
                    camel_name + ".Type : " + utype_name + ".NONE;\n";
            code += "    }\n";
            code += "    set {\n";
            code += "      this." + camel_name + " = new " + utype_name +
                    "Union();\n";
            code += "      this." + camel_name + ".Type = value;\n";
            code += "    }\n";
            code += "  }\n";
          }
        }
        code += "  [Newtonsoft.Json.JsonProperty(\"" + field.name + "\")]\n";
        if (IsUnion(field.value.type)) {
          auto union_name =
              (IsVector(field.value.type))
                  ? GenTypeGet_ObjectAPI(field.value.type.VectorType(), opts)
                  : type_name;
          code += "  [Newtonsoft.Json.JsonConverter(typeof(" + union_name +
                  "_JsonConverter))]\n";
        }
        if (field.attributes.Lookup("hash")) {
          code += "  [Newtonsoft.Json.JsonIgnore()]\n";
        }
      }
      code += "  public " + type_name + " " + camel_name + " { get; set; }\n";
    }
    // Generate Constructor
    code += "\n";
    code += "  public " + class_name + "() {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.value.type.base_type == BASE_TYPE_UTYPE) continue;
      if (field.value.type.element == BASE_TYPE_UTYPE) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      code += "    this." + camel_name + " = ";
      auto type_name = GenTypeGet_ObjectAPI(field.value.type, opts);
      if (IsScalar(field.value.type.base_type)) {
        code += GenDefaultValue(field) + ";\n";
      } else {
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (IsStruct(field.value.type)) {
              code += "new " + type_name + "();\n";
            } else {
              code += "null;\n";
            }
            break;
          }
          case BASE_TYPE_ARRAY: {
            code += "new " + type_name.substr(0, type_name.length() - 1) +
                    NumToString(field.value.type.fixed_length) + "];\n";
            break;
          }
          default: {
            code += "null;\n";
            break;
          }
        }
      }
    }
    code += "  }\n";
    // Generate Serialization
    if (opts.cs_gen_json_serializer &&
        parser_.root_struct_def_ == &struct_def) {
      code += "\n";
      code += "  public static " + class_name +
              " DeserializeFromJson(string jsonText) {\n";
      code += "    return Newtonsoft.Json.JsonConvert.DeserializeObject<" +
              class_name + ">(jsonText);\n";
      code += "  }\n";
      code += "  public string SerializeToJson() {\n";
      code +=
          "    return Newtonsoft.Json.JsonConvert.SerializeObject(this, "
          "Newtonsoft.Json.Formatting.Indented);\n";
      code += "  }\n";
    }
    if (parser_.root_struct_def_ == &struct_def) {
      code += "  public static " + class_name +
              " DeserializeFromBinary(byte[] fbBuffer) {\n";
      code += "    return " + struct_def.name + ".GetRootAs" + struct_def.name +
              "(new ByteBuffer(fbBuffer)).UnPack();\n";
      code += "  }\n";
      code += "  public byte[] SerializeToBinary() {\n";
      code += "    var fbb = new FlatBufferBuilder(0x10000);\n";
      code += "    " + struct_def.name + ".Finish" + struct_def.name +
              "Buffer(fbb, " + struct_def.name + ".Pack(fbb, this));\n";
      code += "    return fbb.DataBuffer.ToSizedArray();\n";
      code += "  }\n";
    }
    code += "}\n\n";
  }